

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultIoResolverBase::resolveUniformLocation
          (TDefaultIoResolverBase *this,EShLanguage param_1,TVarEntryInfo *ent)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *nameStr;
  undefined4 extraout_var_01;
  SpvVersion *pSVar4;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  int location;
  char *name;
  TType *type;
  TVarEntryInfo *ent_local;
  EShLanguage param_1_local;
  TDefaultIoResolverBase *this_local;
  TType *this_00;
  
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  this_00 = (TType *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  nameStr = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    CONCAT44(extraout_var_00,iVar2));
  bVar1 = doAutoLocationMapping(this);
  if (bVar1) {
    iVar2 = (*this_00->_vptr_TType[0xb])();
    bVar1 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_01,iVar2));
    if ((((bVar1) || (uVar3 = (*this_00->_vptr_TType[0x29])(), (uVar3 & 1) != 0)) ||
        (iVar2 = (*this_00->_vptr_TType[7])(), iVar2 == 0x10)) ||
       (((bVar1 = TType::isAtomic(this_00), bVar1 || (bVar1 = TType::isSpirvType(this_00), bVar1))
        || ((uVar3 = (*this_00->_vptr_TType[0x36])(), (uVar3 & 1) != 0 &&
            (pSVar4 = TIntermediate::getSpv(this->referenceIntermediate), pSVar4->openGl == 0))))))
    {
      ent->newLocation = -1;
      this_local._4_4_ = -1;
    }
    else {
      uVar3 = (*this_00->_vptr_TType[0x25])();
      if ((uVar3 & 1) != 0) {
        pvVar5 = &TType::getStruct(this_00)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (pvVar5);
        if (sVar6 == 0) {
          ent->newLocation = -1;
          return -1;
        }
        pvVar5 = &TType::getStruct(this_00)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](pvVar5,0);
        uVar3 = (*pvVar7->type->_vptr_TType[0x29])();
        if ((uVar3 & 1) != 0) {
          ent->newLocation = -1;
          return -1;
        }
      }
      this_local._4_4_ =
           TIntermediate::getUniformLocationOverride(this->referenceIntermediate,nameStr);
      if (this_local._4_4_ == -1) {
        this_local._4_4_ = this->nextUniformLocation;
        iVar2 = TIntermediate::computeTypeUniformLocationSize(this_00);
        this->nextUniformLocation = iVar2 + this->nextUniformLocation;
        ent->newLocation = this_local._4_4_;
      }
      else {
        ent->newLocation = this_local._4_4_;
      }
    }
  }
  else {
    ent->newLocation = -1;
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TDefaultIoResolverBase::resolveUniformLocation(EShLanguage /*stage*/, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    const char* name =  ent.symbol->getAccessName().c_str();
    // kick out of not doing this
    if (! doAutoLocationMapping()) {
        return ent.newLocation = -1;
    }
    // no locations added if already present, a built-in variable, a block, or an opaque
    if (type.getQualifier().hasLocation() || type.isBuiltIn() || type.getBasicType() == EbtBlock ||
        type.isAtomic() || type.isSpirvType() || (type.containsOpaque() && referenceIntermediate.getSpv().openGl == 0)) {
        return ent.newLocation = -1;
    }
    // no locations on blocks of built-in variables
    if (type.isStruct()) {
        if (type.getStruct()->size() < 1) {
            return ent.newLocation = -1;
        }
        if ((*type.getStruct())[0].type->isBuiltIn()) {
            return ent.newLocation = -1;
        }
    }
    int location = referenceIntermediate.getUniformLocationOverride(name);
    if (location != -1) {
        return ent.newLocation = location;
    }
    location = nextUniformLocation;
    nextUniformLocation += TIntermediate::computeTypeUniformLocationSize(type);
    return ent.newLocation = location;
}